

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SslSocket.cpp
# Opt level: O0

void __thiscall SslTcpSocketImpl::Close(SslTcpSocketImpl *this)

{
  bool bVar1;
  int iVar2;
  pointer pSVar3;
  type this_00;
  SSL *__val;
  wchar_t *pOut;
  type puVar4;
  size_t local_c0;
  size_t len_1;
  __array temp_1;
  size_t len;
  __array temp;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_80;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_60;
  size_t local_30;
  size_t nOutDataSize;
  unique_lock<std::mutex> lock;
  bool bNewData;
  SslTcpSocketImpl *this_local;
  
  this->m_bCloseReq = true;
  iVar2 = (*(this->super_TcpSocketImpl).super_BaseSocketImpl._vptr_BaseSocketImpl[8])();
  if ((iVar2 == 0) && (bVar1 = std::operator!=(&this->m_pSslCon,(nullptr_t)0x0), bVar1)) {
    pSVar3 = std::
             unique_ptr<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
             ::operator->(&this->m_pSslCon);
    iVar2 = OpenSSLWrapper::SslConnection::SSLGetShutdown(pSVar3);
    if (iVar2 < 1) {
      lock._15_1_ = 0;
      std::unique_lock<std::mutex>::unique_lock
                ((unique_lock<std::mutex> *)&nOutDataSize,&this->m_mxEnDecode);
      pSVar3 = std::
               unique_ptr<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
               ::operator->(&this->m_pSslCon);
      local_30 = OpenSSLWrapper::SslConnection::SslGetOutDataSize(pSVar3);
      while (local_30 != 0) {
        this_00 = std::
                  unique_ptr<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                  ::operator*(&this->m_pSslCon);
        __val = OpenSSLWrapper::SslConnection::operator()(this_00);
        std::__cxx11::to_wstring((wstring *)&temp,(unsigned_long)__val);
        std::operator+(&local_80,L"SslGetOutDataSize unexpected full: ",
                       (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *
                       )&temp);
        std::operator+(&local_60,&local_80,L"\r\n");
        pOut = (wchar_t *)std::__cxx11::wstring::c_str();
        OutputDebugString(pOut);
        std::__cxx11::wstring::~wstring((wstring *)&local_60);
        std::__cxx11::wstring::~wstring((wstring *)&local_80);
        std::__cxx11::wstring::~wstring((wstring *)&temp);
        std::make_unique<unsigned_char[]>((size_t)&len);
        pSVar3 = std::
                 unique_ptr<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                 ::operator->(&this->m_pSslCon);
        puVar4 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::operator[]
                           ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                            &len,0);
        temp_1._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t
        .super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
        super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
             (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)
             OpenSSLWrapper::SslConnection::SslGetOutData(pSVar3,puVar4,local_30);
        if ((tuple<unsigned_char_*,_std::default_delete<unsigned_char[]>_>)
            temp_1._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
            _M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
            super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl !=
            (_Head_base<0UL,_unsigned_char_*,_false>)0x0) {
          std::mutex::lock(&(this->super_TcpSocketImpl).m_mxOutDeque);
          std::__atomic_base<unsigned_long>::operator+=
                    (&(this->super_TcpSocketImpl).m_atOutBytes.super___atomic_base<unsigned_long>,
                     (__int_type)
                     temp_1._M_t.
                     super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                     super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl);
          std::
          deque<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long>,std::allocator<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long>>>
          ::
          emplace_back<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long_const&>
                    ((deque<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long>,std::allocator<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long>>>
                      *)&(this->super_TcpSocketImpl).m_quOutData,
                     (unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)&len,
                     (unsigned_long *)&temp_1);
          std::mutex::unlock(&(this->super_TcpSocketImpl).m_mxOutDeque);
          lock._15_1_ = 1;
        }
        pSVar3 = std::
                 unique_ptr<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                 ::operator->(&this->m_pSslCon);
        local_30 = OpenSSLWrapper::SslConnection::SslGetOutDataSize(pSVar3);
        std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
                  ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)&len);
      }
      std::unique_lock<std::mutex>::unlock((unique_lock<std::mutex> *)&nOutDataSize);
      if (this->m_iSslInit == 1) {
        pSVar3 = std::
                 unique_ptr<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                 ::operator->(&this->m_pSslCon);
        OpenSSLWrapper::SslConnection::ShutDownConnection(pSVar3,(int *)0x0);
        pSVar3 = std::
                 unique_ptr<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                 ::operator->(&this->m_pSslCon);
        local_30 = OpenSSLWrapper::SslConnection::SslGetOutDataSize(pSVar3);
        while (local_30 != 0) {
          std::make_unique<unsigned_char[]>((size_t)&len_1);
          pSVar3 = std::
                   unique_ptr<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                   ::operator->(&this->m_pSslCon);
          puVar4 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::
                   operator[]((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                              &len_1,0);
          local_c0 = OpenSSLWrapper::SslConnection::SslGetOutData(pSVar3,puVar4,local_30);
          if (local_c0 != 0) {
            std::__atomic_base<unsigned_long>::operator+=
                      (&(this->super_TcpSocketImpl).m_atOutBytes.super___atomic_base<unsigned_long>,
                       local_c0);
            std::
            deque<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long>,std::allocator<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long>>>
            ::
            emplace_back<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long_const&>
                      ((deque<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long>,std::allocator<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long>>>
                        *)&(this->super_TcpSocketImpl).m_quOutData,
                       (unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)&len_1,
                       &local_c0);
            lock._15_1_ = 1;
          }
          pSVar3 = std::
                   unique_ptr<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                   ::operator->(&this->m_pSslCon);
          local_30 = OpenSSLWrapper::SslConnection::SslGetOutDataSize(pSVar3);
          std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
                    ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)&len_1);
        }
      }
      if ((lock._15_1_ & 1) == 1) {
        TcpSocketImpl::TriggerWriteThread(&this->super_TcpSocketImpl);
      }
      std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&nOutDataSize);
    }
  }
  TcpSocketImpl::Close(&this->super_TcpSocketImpl);
  return;
}

Assistant:

void SslTcpSocketImpl::Close()
{
    //OutputDebugString(L"SslTcpSocketImpl::Close\r\n");
    m_bCloseReq = true;

    if (GetErrorNo() == 0)  // We get here not because of an error
    {
        if (m_pSslCon != nullptr && m_pSslCon->SSLGetShutdown() < SSL_SENT_SHUTDOWN)
        {
            bool bNewData = false;
            unique_lock<mutex> lock(m_mxEnDecode);
            size_t nOutDataSize = m_pSslCon->SslGetOutDataSize();
            while (nOutDataSize > 0)
            {
                OutputDebugString(wstring(L"SslGetOutDataSize unexpected full: " + to_wstring(reinterpret_cast<size_t>((*m_pSslCon)())) + L"\r\n").c_str());
                auto temp = make_unique<uint8_t[]>(nOutDataSize);
                const size_t len = m_pSslCon->SslGetOutData(&temp[0], nOutDataSize);
                // Schreibt Daten in die SOCKET
                if (len > 0)
                {
                    m_mxOutDeque.lock();
                    m_atOutBytes += len;
                    m_quOutData.emplace_back(move(temp), len);
                    m_mxOutDeque.unlock();
                    bNewData = true;
                }
                nOutDataSize = m_pSslCon->SslGetOutDataSize();
            }
            lock.unlock();

            if (m_iSslInit == 1)
            {
                m_pSslCon->ShutDownConnection();
                // Get the out Que of the openssl bio, the buffer is already encrypted
                nOutDataSize = m_pSslCon->SslGetOutDataSize();
                while (nOutDataSize > 0)
                {
                    auto temp = make_unique<uint8_t[]>(nOutDataSize);
                    const size_t len = m_pSslCon->SslGetOutData(&temp[0], nOutDataSize);
                    // Schreibt Daten in die SOCKET
                    if (len > 0)
                    {
                        m_atOutBytes += len;
                        m_quOutData.emplace_back(move(temp), len);
                        bNewData = true;
                    }
                    nOutDataSize = m_pSslCon->SslGetOutDataSize();
                }
            }

            if (bNewData == true)
                TriggerWriteThread();
        }
    }

    TcpSocketImpl::Close();
}